

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

char * resultFilename(char *filename,char *out,char *suffix)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char res [500];
  char suffixbuff [500];
  char acStack_418 [499];
  undefined1 local_225;
  char local_218 [504];
  
  if (filename == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar2 = strlen(filename);
    pcVar3 = filename + sVar2;
    if (0 < (long)sVar2) {
      do {
        if (*pcVar3 == '/') break;
        pcVar3 = pcVar3 + -1;
      } while (filename < pcVar3);
    }
    pcVar3 = pcVar3 + (*pcVar3 == '/');
  }
  pcVar4 = "";
  if (out != (char *)0x0) {
    pcVar4 = out;
  }
  strncpy(local_218,suffix,499);
  iVar1 = snprintf(acStack_418,499,"%s%s%s",pcVar4,pcVar3,local_218);
  if (0x1f2 < iVar1) {
    local_225 = 0;
  }
  pcVar3 = strdup(acStack_418);
  return pcVar3;
}

Assistant:

static char *resultFilename(const char *filename, const char *out,
                            const char *suffix) {
    const char *base;
    char res[500];
    char suffixbuff[500];

/*************
    if ((filename[0] == 't') && (filename[1] == 'e') &&
        (filename[2] == 's') && (filename[3] == 't') &&
	(filename[4] == '/'))
	filename = &filename[5];
 *************/

    base = baseFilename(filename);
    if (suffix == NULL)
        suffix = ".tmp";
    if (out == NULL)
        out = "";

    strncpy(suffixbuff,suffix,499);
#ifdef VMS
    if(strstr(base,".") && suffixbuff[0]=='.')
      suffixbuff[0]='_';
#endif

    if (snprintf(res, 499, "%s%s%s", out, base, suffixbuff) >= 499)
        res[499] = 0;
    return(strdup(res));
}